

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  _Alloc_hider a;
  size_type __n;
  _Alloc_hider __s1;
  size_type __n_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  string *psVar9;
  DIR *__dirp;
  dirent *pdVar10;
  ulong uVar11;
  long *plVar12;
  string *psVar13;
  PerExpandData *pPVar14;
  undefined8 *puVar15;
  undefined8 extraout_RAX;
  size_type *psVar16;
  uint uVar17;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  string *psVar18;
  undefined8 uVar19;
  undefined8 *puVar20;
  string *psVar21;
  char *pcVar22;
  pointer pbVar23;
  DIR *pDVar24;
  long lVar25;
  undefined8 *puVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  string fname;
  string stroutput_none;
  string stroutput_ws;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  vector<Testdata,_std::allocator<Testdata>_> testdata;
  string stroutput_strnone;
  string stroutput_strws;
  string rootdir;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  Testdata local_1c0;
  string local_150;
  undefined **local_130;
  Testdata *local_128;
  undefined8 *local_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  string *local_e0;
  ExpandEmitter *local_d8;
  ExpandEmitter *local_d0;
  ExpandEmitter *local_c8;
  ExpandEmitter *local_c0;
  string *local_b8;
  pointer local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  ExpandEmitter *local_78;
  ExpandEmitter *local_70;
  PerExpandData *local_68;
  undefined8 *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar7 = getenv("TEMPLATE_ROOTDIR");
  pcVar22 = ".";
  if (pcVar7 != (char *)0x0) {
    pcVar22 = pcVar7;
  }
  local_1c0.input_template_name._M_dataplus._M_p = (pointer)&local_1c0.input_template_name.field_2;
  sVar8 = strlen(pcVar22);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar22,pcVar22 + sVar8);
  pDVar24 = (DIR *)(local_1e0 + 0x10);
  local_1e0._0_8_ = pDVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"src","");
  ctemplate::PathJoin((string *)local_50,(string *)&local_1c0);
  if ((DIR *)local_1e0._0_8_ != pDVar24) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.input_template_name._M_dataplus._M_p != &local_1c0.input_template_name.field_2) {
    operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
  }
  local_1e0._0_8_ = pDVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"tests","");
  ctemplate::PathJoin((string *)&local_1c0,(string *)local_50);
  std::__cxx11::string::operator=((string *)local_50,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.input_template_name._M_dataplus._M_p != &local_1c0.input_template_name.field_2) {
    operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
  }
  if ((DIR *)local_1e0._0_8_ != pDVar24) {
    operator_delete((void *)local_1e0._0_8_);
  }
  psVar9 = (string *)ctemplate::mutable_default_template_cache();
  ctemplate::TemplateCache::SetTemplateRootDirectory(psVar9);
  ctemplate::default_template_cache();
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  local_f8._M_allocated_capacity = 0;
  local_f8._8_8_ = (undefined8 *)0x0;
  local_e8 = 0;
  local_118._16_8_ = (pointer)0x0;
  local_118._0_8_ = (pointer)0x0;
  local_118._8_8_ = (pointer)0x0;
  local_e0 = local_b8;
  __dirp = opendir((char *)local_b8);
  if (__dirp == (DIR *)0x0) {
    main_cold_2();
  }
  else {
    pdVar10 = readdir(__dirp);
    if (pdVar10 != (dirent *)0x0) {
      do {
        pcVar22 = pdVar10->d_name;
        iVar6 = strncmp(pcVar22,"template_unittest_test",0x16);
        if (iVar6 == 0) {
          local_1c0.input_template_name._M_dataplus._M_p =
               (pointer)&local_1c0.input_template_name.field_2;
          sVar8 = strlen(pcVar22);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,pcVar22,pcVar22 + sVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_118,
                     &local_1c0.input_template_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0.input_template_name._M_dataplus._M_p !=
              &local_1c0.input_template_name.field_2) {
            operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
          }
        }
        pdVar10 = readdir(__dirp);
      } while (pdVar10 != (dirent *)0x0);
    }
    iVar6 = closedir(__dirp);
    uVar3 = local_118._8_8_;
    uVar19 = local_118._0_8_;
    pDVar24 = __dirp;
    if (iVar6 == 0) {
      if (local_118._0_8_ != local_118._8_8_) {
        uVar11 = (long)(local_118._8_8_ - local_118._0_8_) >> 5;
        lVar25 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar25 == 0; lVar25 = lVar25 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_118._0_8_,local_118._8_8_,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar19,uVar3);
        if (local_118._0_8_ != local_118._8_8_) {
          paVar1 = &local_1c0.input_template.field_2;
          pbVar23 = (pointer)local_118._0_8_;
          do {
            std::__cxx11::string::string
                      ((string *)&local_150,(char *)local_e0,(allocator *)(local_a8 + 0x10));
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
            local_1c0.input_template_name._M_dataplus._M_p =
                 (pointer)&local_1c0.input_template_name.field_2;
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_1c0.input_template_name.field_2._M_allocated_capacity = *psVar16;
              local_1c0.input_template_name.field_2._8_8_ = plVar12[3];
            }
            else {
              local_1c0.input_template_name.field_2._M_allocated_capacity = *psVar16;
              local_1c0.input_template_name._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_1c0.input_template_name._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_1c0);
            pDVar24 = (DIR *)(plVar12 + 2);
            if ((DIR *)*plVar12 == pDVar24) {
              local_1d0._M_allocated_capacity = *(undefined8 *)pDVar24;
              local_1d0._8_8_ = plVar12[3];
              local_1e0._0_8_ = (DIR *)(local_1e0 + 0x10);
            }
            else {
              local_1d0._M_allocated_capacity = *(undefined8 *)pDVar24;
              local_1e0._0_8_ = (DIR *)*plVar12;
            }
            local_1e0._8_8_ = plVar12[1];
            *plVar12 = (long)pDVar24;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0.input_template_name._M_dataplus._M_p !=
                &local_1c0.input_template_name.field_2) {
              operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p);
            }
            paVar2 = &local_1c0.input_template_name.field_2;
            local_1c0.input_template_name._M_string_length = 3;
            local_1c0.input_template_name.field_2._M_allocated_capacity._0_4_ = 0x6e692e;
            local_1c0.input_template_name._M_dataplus._M_p = (pointer)paVar2;
            bVar4 = EndsWith((string *)local_1e0,&local_1c0.input_template_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0.input_template_name._M_dataplus._M_p != paVar2) {
              operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
            }
            if (bVar4) {
              local_1c0.input_template_name._M_dataplus._M_p =
                   (pointer)&local_1c0.input_template_name.field_2;
              local_1c0.input_template.field_2._M_allocated_capacity = 0;
              local_1c0.input_template.field_2._8_8_ = 0;
              local_1c0.input_template._M_string_length = 0;
              local_1c0.input_template_name.field_2._M_allocated_capacity = 0;
              local_1c0.input_template_name.field_2._8_8_ = 0;
              local_1c0.input_template_name._M_string_length = 0;
              local_1c0.annotated_output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1c0.annotated_output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1c0.output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1c0.annotated_output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1c0.output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1c0.output.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1c0.input_template._M_dataplus._M_p = (pointer)paVar1;
              std::vector<Testdata,_std::allocator<Testdata>_>::emplace_back<Testdata>
                        ((vector<Testdata,_std::allocator<Testdata>_> *)&local_f8,&local_1c0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1c0.annotated_output);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1c0.output);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0.input_template._M_dataplus._M_p != paVar1) {
                operator_delete(local_1c0.input_template._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0.input_template_name._M_dataplus._M_p !=
                  &local_1c0.input_template_name.field_2) {
                operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
              }
              std::__cxx11::string::_M_assign((string *)(local_f8._8_8_ + -0x70));
              ReadToString((string *)local_1e0,(string *)(local_f8._8_8_ + -0x50));
            }
            else {
              paVar2 = &local_1c0.input_template_name.field_2;
              local_1c0.input_template_name._M_string_length = 4;
              local_1c0.input_template_name.field_2._M_allocated_capacity._0_5_ = 0x74756f2e;
              local_1c0.input_template_name._M_dataplus._M_p = (pointer)paVar2;
              bVar4 = EndsWith((string *)local_1e0,&local_1c0.input_template_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0.input_template_name._M_dataplus._M_p != paVar2) {
                operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
              }
              lVar25 = -0x30;
              if (!bVar4) {
                paVar2 = &local_1c0.input_template_name.field_2;
                local_1c0.input_template_name.field_2._M_allocated_capacity = 0x756f5f6f6e6e612e;
                local_1c0.input_template_name._M_string_length = 9;
                local_1c0.input_template_name.field_2._8_2_ = 0x74;
                local_1c0.input_template_name._M_dataplus._M_p = (pointer)paVar2;
                bVar4 = EndsWith((string *)local_1e0,&local_1c0.input_template_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.input_template_name._M_dataplus._M_p != paVar2) {
                  operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
                }
                lVar25 = -0x18;
                if (!bVar4) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,199,"false");
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,199,"vector<Testdata> ReadDataFiles(const char *)");
                }
              }
              uVar19 = local_f8._8_8_;
              if (local_f8._M_allocated_capacity == local_f8._8_8_) {
                printf("%s: %d: ASSERT FAILED: %s\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                       ,0xca,"!retval.empty()");
                if (local_f8._M_allocated_capacity == local_f8._8_8_) {
                  __assert_fail("!retval.empty()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0xca,"vector<Testdata> ReadDataFiles(const char *)");
                }
LAB_00105947:
                exit(1);
              }
              if (pbVar23->_M_string_length <= *(long *)(local_f8._8_8_ + -0x68) + 4U) {
                printf("%s: %d: ASSERT FAILED: %s\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                       ,0xcb,"it->length() > retval.back().input_template_name.length() + 4");
                if (pbVar23->_M_string_length <= *(long *)(local_f8._8_8_ + -0x68) + 4U) {
                  __assert_fail("it->length() > retval.back().input_template_name.length() + 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0xcb,"vector<Testdata> ReadDataFiles(const char *)");
                }
                goto LAB_00105947;
              }
              iVar6 = atoi((pbVar23->_M_dataplus)._M_p + *(long *)(local_f8._8_8_ + -0x68) + 2);
              if (iVar6 == 0) {
                printf("%s: %d: ASSERT FAILED: %s\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                       ,0xd0,"dictnum");
                __assert_fail("dictnum",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                              ,0xd0,"vector<Testdata> ReadDataFiles(const char *)");
              }
              this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (uVar19 + lVar25);
              while ((ulong)(*(long *)(this + 8) - *(long *)this >> 5) < (ulong)(long)iVar6) {
                paVar2 = &local_1c0.input_template_name.field_2;
                local_1c0.input_template_name._M_string_length = 0;
                local_1c0.input_template_name.field_2._M_allocated_capacity =
                     local_1c0.input_template_name.field_2._M_allocated_capacity &
                     0xffffffffffffff00;
                local_1c0.input_template_name._M_dataplus._M_p = (pointer)paVar2;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(this,&local_1c0.input_template_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.input_template_name._M_dataplus._M_p != paVar2) {
                  operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
                }
              }
              ReadToString((string *)local_1e0,
                           (string *)(*(long *)this + (long)iVar6 * 0x20 + -0x20));
            }
            if ((DIR *)local_1e0._0_8_ != (DIR *)(local_1e0 + 0x10)) {
              operator_delete((void *)local_1e0._0_8_);
            }
            pbVar23 = pbVar23 + 1;
          } while (pbVar23 != (pointer)local_118._8_8_);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      if (local_b8 != (string *)local_a8) {
        operator_delete(local_b8);
      }
      local_60 = (undefined8 *)local_f8._8_8_;
      uVar19 = local_f8._M_allocated_capacity;
      if (local_f8._M_allocated_capacity == local_f8._8_8_) {
        iVar6 = 1;
        pcVar22 = "FATAL ERROR: No test files found for template_regtest";
      }
      else {
        do {
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)uVar19;
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 8);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_70 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate((TemplateString *)&local_1c0,DO_NOT_STRIP);
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)uVar19;
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 8);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_c0 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate
                               ((TemplateString *)&local_1c0,STRIP_BLANK_LINES);
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)uVar19;
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 8);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_78 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate((TemplateString *)&local_1c0,STRIP_WHITESPACE)
          ;
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)(uVar19 + 0x20);
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 0x28);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_c8 = (ExpandEmitter *)
                     ctemplate::Template::StringToTemplate
                               ((TemplateString *)&local_1c0,DO_NOT_STRIP);
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)(uVar19 + 0x20);
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 0x28);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_d0 = (ExpandEmitter *)
                     ctemplate::Template::StringToTemplate
                               ((TemplateString *)&local_1c0,STRIP_BLANK_LINES);
          local_1c0.input_template_name._M_dataplus._M_p = *(pointer *)(uVar19 + 0x20);
          local_1c0.input_template_name._M_string_length = *(undefined8 *)(uVar19 + 0x28);
          local_1c0.input_template_name.field_2._M_allocated_capacity =
               local_1c0.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c0.input_template_name.field_2._8_8_ = 0;
          local_d8 = (ExpandEmitter *)
                     ctemplate::Template::StringToTemplate
                               ((TemplateString *)&local_1c0,STRIP_WHITESPACE);
          psVar18 = *(string **)(uVar19 + 0x40);
          psVar13 = *(string **)(uVar19 + 0x48);
          local_120 = (undefined8 *)uVar19;
          if (psVar18 != psVar13) {
            bVar4 = local_70 == (ExpandEmitter *)0x0;
            bVar27 = local_c0 == (ExpandEmitter *)0x0;
            bVar28 = local_78 == (ExpandEmitter *)0x0;
            bVar29 = local_c8 == (ExpandEmitter *)0x0;
            bVar30 = local_d0 == (ExpandEmitter *)0x0;
            bVar31 = local_d8 == (ExpandEmitter *)0x0;
            psVar21 = psVar18;
            do {
              local_e0 = psVar21;
              if (psVar21->_M_string_length != 0) {
                uVar17 = (int)((ulong)((long)psVar18 - *(undefined8 *)(uVar19 + 0x40)) >> 5) + 1;
                local_58 = psVar18;
                printf("Testing template %s on dict #%d\n",*(undefined8 *)uVar19,(ulong)uVar17);
                if (bVar28 || (bVar27 || bVar4)) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x19d,"tpl_none && tpl_lines && tpl_ws");
                  __assert_fail("tpl_none && tpl_lines && tpl_ws",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x19d,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                if (bVar31 || (bVar30 || bVar29)) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x19e,"tplstr_none && tplstr_lines && tplstr_ws");
                  __assert_fail("tplstr_none && tplstr_lines && tplstr_ws",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x19e,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                local_68 = (PerExpandData *)MakeDictionary(uVar17);
                local_1c0.input_template_name._M_dataplus._M_p =
                     (pointer)&local_1c0.input_template_name.field_2;
                local_1c0.input_template_name._M_string_length = 0;
                local_1c0.input_template_name.field_2._M_allocated_capacity =
                     local_1c0.input_template_name.field_2._M_allocated_capacity &
                     0xffffffffffffff00;
                local_1e0._8_8_ = (pointer)0x0;
                local_1d0._M_allocated_capacity =
                     local_1d0._M_allocated_capacity & 0xffffffffffffff00;
                local_150._M_string_length = 0;
                local_150.field_2._M_local_buf[0] = '\0';
                local_b0 = (pointer)0x0;
                local_a8[0] = 0;
                local_118._0_8_ = local_118 + 0x10;
                local_118._8_8_ = (pointer)0x0;
                local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                local_98._M_allocated_capacity = (size_type)local_88;
                local_98._8_8_ = (pointer)0x0;
                local_88[0] = 0;
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_1e0._0_8_ = (DIR *)(local_1e0 + 0x10);
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                local_128 = &local_1c0;
                local_b8 = (string *)local_a8;
                ctemplate::default_template_cache();
                pPVar14 = local_68;
                ctemplate::Template::ExpandWithDataAndCache
                          (local_70,(TemplateDictionaryInterface *)&local_130,local_68,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)local_1e0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_c0,(TemplateDictionaryInterface *)&local_130,pPVar14,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_150;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_78,(TemplateDictionaryInterface *)&local_130,pPVar14,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_b8;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_c8,(TemplateDictionaryInterface *)&local_130,pPVar14,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)local_118;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_d0,(TemplateDictionaryInterface *)&local_130,pPVar14,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)(local_a8 + 0x10);
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_d8,(TemplateDictionaryInterface *)&local_130,pPVar14,
                           (TemplateCache *)0x0);
                bVar5 = StringEq(local_e0,&local_150,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                 ,0x1ad,"*out","stroutput_ws");
                __n_00 = local_150._M_string_length;
                __n = local_1c0.input_template_name._M_string_length;
                if (!bVar5) {
                  __assert_fail("StringEq(*out, stroutput_ws, __FILE__, __LINE__, \"*out\", \"stroutput_ws\")"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x1ad,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                if ((local_1c0.input_template_name._M_string_length == local_150._M_string_length)
                   && (((pointer)local_1c0.input_template_name._M_string_length == (pointer)0x0 ||
                       (iVar6 = bcmp(local_1c0.input_template_name._M_dataplus._M_p,
                                     local_150._M_dataplus._M_p,
                                     local_1c0.input_template_name._M_string_length), iVar6 == 0))))
                {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b2,"stroutput_none != stroutput_ws");
                  if ((local_1c0.input_template_name._M_string_length == local_150._M_string_length)
                     && (((pointer)local_1c0.input_template_name._M_string_length == (pointer)0x0 ||
                         (iVar6 = bcmp(local_1c0.input_template_name._M_dataplus._M_p,
                                       local_150._M_dataplus._M_p,
                                       local_1c0.input_template_name._M_string_length), iVar6 == 0))
                        )) {
                    __assert_fail("stroutput_none != stroutput_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b2,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                uVar3 = local_1e0._8_8_;
                uVar19 = local_1e0._0_8_;
                if ((local_1e0._8_8_ == __n_00) &&
                   (((pointer)__n_00 == (pointer)0x0 ||
                    (iVar6 = bcmp((void *)local_1e0._0_8_,local_150._M_dataplus._M_p,__n_00),
                    iVar6 == 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b3,"stroutput_lines != stroutput_ws");
                  if ((local_1e0._8_8_ == local_150._M_string_length) &&
                     (((pointer)local_1e0._8_8_ == (pointer)0x0 ||
                      (iVar6 = bcmp((void *)local_1e0._0_8_,local_150._M_dataplus._M_p,
                                    local_1e0._8_8_), iVar6 == 0)))) {
                    __assert_fail("stroutput_lines != stroutput_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b3,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                a._M_p = local_1c0.input_template_name._M_dataplus._M_p;
                bVar5 = StreqExcept(local_1c0.input_template_name._M_dataplus._M_p,(char *)uVar19,
                                    " \t\v\f\r\n");
                __s1._M_p = local_150._M_dataplus._M_p;
                if (!bVar5) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b5,
                         "StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                        );
                  bVar4 = StreqExcept(local_1c0.input_template_name._M_dataplus._M_p,
                                      (char *)local_1e0._0_8_," \t\v\f\r\n");
                  if (!bVar4) {
                    __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b5,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                bVar5 = StreqExcept(a._M_p,local_150._M_dataplus._M_p," \t\v\f\r\n");
                if (!bVar5) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b7,
                         "StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                        );
                  bVar4 = StreqExcept(local_1c0.input_template_name._M_dataplus._M_p,
                                      local_150._M_dataplus._M_p," \t\v\f\r\n");
                  if (!bVar4) {
                    __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b7,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                if (((pointer)__n != local_b0) ||
                   (((pointer)__n != (pointer)0x0 && (iVar6 = bcmp(a._M_p,local_b8,__n), iVar6 != 0)
                    ))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1ba,"stroutput_none == stroutput_strnone");
                  if (((pointer)local_1c0.input_template_name._M_string_length != local_b0) ||
                     (((pointer)local_1c0.input_template_name._M_string_length != (pointer)0x0 &&
                      (iVar6 = bcmp(local_1c0.input_template_name._M_dataplus._M_p,local_b8,
                                    local_1c0.input_template_name._M_string_length), iVar6 != 0))))
                  {
                    __assert_fail("stroutput_none == stroutput_strnone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1ba,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                if ((uVar3 != local_118._8_8_) ||
                   (((pointer)uVar3 != (pointer)0x0 &&
                    (iVar6 = bcmp((void *)uVar19,(void *)local_118._0_8_,uVar3), iVar6 != 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1bb,"stroutput_lines == stroutput_strlines");
                  if ((local_1e0._8_8_ != local_118._8_8_) ||
                     (((pointer)local_1e0._8_8_ != (pointer)0x0 &&
                      (iVar6 = bcmp((void *)local_1e0._0_8_,(void *)local_118._0_8_,local_1e0._8_8_)
                      , iVar6 != 0)))) {
                    __assert_fail("stroutput_lines == stroutput_strlines",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1bb,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                if ((__n_00 != local_98._8_8_) ||
                   (((pointer)__n_00 != (pointer)0x0 &&
                    (iVar6 = bcmp(__s1._M_p,(void *)local_98._M_allocated_capacity,__n_00),
                    iVar6 != 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1bc,"stroutput_ws == stroutput_strws");
                  if ((local_150._M_string_length != local_98._8_8_) ||
                     (((pointer)local_150._M_string_length != (pointer)0x0 &&
                      (iVar6 = bcmp(local_150._M_dataplus._M_p,
                                    (void *)local_98._M_allocated_capacity,
                                    local_150._M_string_length), iVar6 != 0)))) {
                    __assert_fail("stroutput_ws == stroutput_strws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1bc,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                (**(code **)(local_68->annotate_path_ + 8))();
                if ((undefined1 *)local_98._M_allocated_capacity != local_88) {
                  operator_delete((void *)local_98._M_allocated_capacity);
                }
                psVar18 = local_58;
                if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                  operator_delete((void *)local_118._0_8_);
                }
                if (local_b8 != (string *)local_a8) {
                  operator_delete(local_b8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p);
                }
                if ((DIR *)local_1e0._0_8_ != (DIR *)(local_1e0 + 0x10)) {
                  operator_delete((void *)local_1e0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0.input_template_name._M_dataplus._M_p !=
                    &local_1c0.input_template_name.field_2) {
                  operator_delete(local_1c0.input_template_name._M_dataplus._M_p);
                }
                psVar13 = (string *)local_120[9];
                uVar19 = local_120;
              }
              psVar21 = local_e0 + 1;
              psVar18 = psVar18 + 1;
            } while (psVar21 != psVar13);
          }
          puVar20 = *(undefined8 **)(uVar19 + 0x58);
          puVar15 = *(undefined8 **)(uVar19 + 0x60);
          puVar26 = puVar20;
          if (puVar20 != puVar15) {
            do {
              if (puVar20[1] != 0) {
                uVar17 = (int)((ulong)((long)puVar26 - *(undefined8 *)(uVar19 + 0x58)) >> 5) + 1;
                printf("Testing template %s on dict #%d (annotated)\n",*(undefined8 *)uVar19,
                       (ulong)uVar17);
                pPVar14 = (PerExpandData *)MakeDictionary(uVar17);
                local_1c0.input_template_name._M_string_length = 0;
                local_1c0.input_template_name.field_2._M_allocated_capacity = 0;
                local_1c0.input_template_name.field_2._8_8_ = 0;
                local_1c0.input_template_name._M_dataplus._M_p = "template_unittest_test";
                local_1e0._0_8_ = local_1e0 + 0x10;
                local_1e0._8_8_ = (pointer)0x0;
                local_1d0._M_allocated_capacity =
                     local_1d0._M_allocated_capacity & 0xffffffffffffff00;
                local_150._M_dataplus._M_p = (pointer)&PTR__ExpandEmitter_0010cd20;
                local_150._M_string_length = (size_type)local_1e0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_c0,(TemplateDictionaryInterface *)&local_150,pPVar14,
                           (TemplateCache *)&local_1c0);
                bVar4 = StreqExcept((char *)*puVar20,(char *)local_1e0._0_8_,"\r\n");
                if (!bVar4) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1d2,"StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")");
                  bVar4 = StreqExcept((char *)*puVar20,(char *)local_1e0._0_8_,"\r\n");
                  if (!bVar4) {
                    __assert_fail("StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1d2,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_00105947;
                }
                (**(code **)(pPVar14->annotate_path_ + 8))(pPVar14);
                if ((DIR *)local_1e0._0_8_ != (DIR *)(local_1e0 + 0x10)) {
                  operator_delete((void *)local_1e0._0_8_);
                }
                ctemplate::PerExpandData::~PerExpandData((PerExpandData *)&local_1c0);
                puVar15 = (undefined8 *)local_120[0xc];
                uVar19 = local_120;
              }
              puVar20 = puVar20 + 4;
              puVar26 = puVar26 + 4;
            } while (puVar20 != puVar15);
          }
          if (local_c8 != (ExpandEmitter *)0x0) {
            (*local_c8->_vptr_ExpandEmitter[1])();
            uVar19 = local_120;
          }
          if (local_d0 != (ExpandEmitter *)0x0) {
            (*local_d0->_vptr_ExpandEmitter[1])();
            uVar19 = local_120;
          }
          puVar20 = (undefined8 *)uVar19;
          if (local_d8 != (ExpandEmitter *)0x0) {
            (*local_d8->_vptr_ExpandEmitter[1])();
            puVar20 = local_120;
          }
          uVar19 = puVar20 + 0xe;
        } while (puVar20 + 0xe != local_60);
        iVar6 = 0;
        pcVar22 = "DONE";
      }
      puts(pcVar22);
      std::vector<Testdata,_std::allocator<Testdata>_>::~vector
                ((vector<Testdata,_std::allocator<Testdata>_> *)&local_f8);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return iVar6;
    }
  }
  main_cold_1();
  if ((DIR *)local_1e0._0_8_ != pDVar24) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string rootdir = GOOGLE_NAMESPACE::PathJoin(template_rootdir, "src");
  rootdir = GOOGLE_NAMESPACE::PathJoin(rootdir, "tests");
  Template::SetTemplateRootDirectory(rootdir);

  vector<Testdata> testdata = ReadDataFiles(
      Template::template_root_directory().c_str());
  if (testdata.empty()) {
    printf("FATAL ERROR: No test files found for template_regtest\n");
    return 1;
  }

  TestExpand(testdata.begin(), testdata.end());

  printf("DONE\n");
  return 0;
}